

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O1

string * __thiscall
wabt::LoadStoreTracking::GenAccess_abi_cxx11_
          (string *__return_storage_ptr__,LoadStoreTracking *this,uint64_t offset,Node *addr_exp)

{
  int iVar1;
  const_iterator cVar2;
  _Base_ptr *pp_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  char *pcVar6;
  string *s;
  uint uVar7;
  char *pcVar8;
  bool bVar9;
  string name;
  string local_48;
  
  AddrExpName_abi_cxx11_(&local_48,this,addr_exp);
  if ((local_48._M_string_length == 0) ||
     (cVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
                      *)this,&local_48),
     (_Rb_tree_header *)cVar2._M_node == &(this->vars)._M_t._M_impl.super__Rb_tree_header)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
LAB_00151a79:
    pcVar6 = "";
    pcVar8 = "";
  }
  else {
    if (*(char *)&cVar2._M_node[3]._M_left == '\x01') {
      pp_Var3 = &cVar2._M_node[2]._M_parent;
      p_Var4 = (_Base_ptr)pp_Var3;
      for (p_Var5 = cVar2._M_node[2]._M_left; p_Var5 != (_Base_ptr)0x0;
          p_Var5 = (&p_Var5->_M_left)[*(ulong *)(p_Var5 + 1) < offset]) {
        if (*(ulong *)(p_Var5 + 1) >= offset) {
          p_Var4 = p_Var5;
        }
      }
      p_Var5 = (_Base_ptr)pp_Var3;
      if ((p_Var4 != (_Base_ptr)pp_Var3) && (p_Var5 = p_Var4, offset < *(ulong *)(p_Var4 + 1))) {
        p_Var5 = (_Base_ptr)pp_Var3;
      }
      if (p_Var5 == (_Base_ptr)pp_Var3) {
        __assert_fail("ait != it->second.accesses.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/decompiler-ls.h"
                      ,0xf8,
                      "std::string wabt::LoadStoreTracking::GenAccess(uint64_t, const Node &) const"
                     );
      }
      uVar7 = *(uint *)((long)&p_Var5[1]._M_left + 4);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      do {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        bVar9 = 0x19 < uVar7;
        uVar7 = uVar7 / 0x1a - 1;
      } while (bVar9);
      goto LAB_00151a8b;
    }
    iVar1 = *(int *)((long)&cVar2._M_node[3]._M_left + 4);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (iVar1 == -0x40) goto LAB_00151a79;
    pcVar8 = "*";
    pcVar6 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar8,pcVar6);
LAB_00151a8b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenAccess(uint64_t offset, const Node& addr_exp) const {
    auto name = AddrExpName(addr_exp);
    if (name.empty()) {
      return "";
    }
    auto it = vars.find(name);
    if (it == vars.end()) {
      return "";
    }
    if (it->second.struct_layout) {
      auto ait = it->second.accesses.find(offset);
      assert (ait != it->second.accesses.end());
      return IdxToName(ait->second.idx);
    }
    // Not a struct, see if it is a typed pointer.
    if (it->second.same_type != Type::Void) {
      return "*";
    }
    return "";
  }